

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_constant_aggregator.cpp
# Opt level: O3

void __thiscall
duckdb::WindowConstantAggregatorLocalState::WindowConstantAggregatorLocalState
          (WindowConstantAggregatorLocalState *this,WindowConstantAggregatorGlobalState *gstate)

{
  DataChunk *this_00;
  atomic<unsigned_long> *paVar1;
  WindowAggregator *pWVar2;
  Allocator *pAVar3;
  Value local_70;
  
  (this->super_WindowAggregatorLocalState).super_WindowAggregatorState._vptr_WindowAggregatorState =
       (_func_int **)&PTR__WindowAggregatorState_0246bb18;
  pAVar3 = Allocator::DefaultAllocator();
  ArenaAllocator::ArenaAllocator
            (&(this->super_WindowAggregatorLocalState).super_WindowAggregatorState.allocator,pAVar3,
             0x800);
  (this->super_WindowAggregatorLocalState).cursor.
  super_unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>._M_t.
  super___uniq_ptr_impl<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::WindowCursor_*,_std::default_delete<duckdb::WindowCursor>_>.
  super__Head_base<0UL,_duckdb::WindowCursor_*,_false>._M_head_impl = (WindowCursor *)0x0;
  (this->super_WindowAggregatorLocalState).super_WindowAggregatorState._vptr_WindowAggregatorState =
       (_func_int **)&PTR__WindowConstantAggregatorLocalState_0246bb58;
  this->gstate = gstate;
  this_00 = &this->inputs;
  DataChunk::DataChunk(this_00);
  DataChunk::DataChunk(&this->payload_chunk);
  Value::POINTER(&local_70,0);
  Vector::Vector(&this->statep,&local_70);
  Value::~Value(&local_70);
  WindowAggregateStates::WindowAggregateStates(&this->statef,&(gstate->statef).aggr);
  (this->matches).selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  (this->matches).selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->partition = 0;
  (this->matches).sel_vector = (sel_t *)0x0;
  SelectionVector::Initialize(&this->matches,0x800);
  pWVar2 = (gstate->super_WindowAggregatorGlobalState).aggregator;
  WindowAggregateStates::Initialize
            (&this->statef,
             ((long)(gstate->partition_offsets).
                    super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(gstate->partition_offsets).
                    super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) - 1);
  pAVar3 = Allocator::DefaultAllocator();
  DataChunk::Initialize(this_00,pAVar3,&pWVar2->arg_types,0x800);
  DataChunk::GetTypes((vector<duckdb::LogicalType,_true> *)&local_70,this_00);
  DataChunk::InitializeEmpty(&this->payload_chunk,(vector<duckdb::LogicalType,_true> *)&local_70);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_70);
  LOCK();
  paVar1 = &(gstate->super_WindowAggregatorGlobalState).locals;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  return;
}

Assistant:

WindowConstantAggregatorLocalState::WindowConstantAggregatorLocalState(
    const WindowConstantAggregatorGlobalState &gstate)
    : gstate(gstate), statep(Value::POINTER(0)), statef(gstate.statef.aggr), partition(0) {
	matches.Initialize();

	//	Start the aggregates
	auto &partition_offsets = gstate.partition_offsets;
	auto &aggregator = gstate.aggregator;
	statef.Initialize(partition_offsets.size() - 1);

	// Set up shared buffer
	inputs.Initialize(Allocator::DefaultAllocator(), aggregator.arg_types);
	payload_chunk.InitializeEmpty(inputs.GetTypes());

	gstate.locals++;
}